

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char **argv_local;
  int argc_local;
  
  printf("Signal/Basic Tests: ");
  BasicSignalTests::run();
  printf("OK\n");
  printf("Signal/CollectorVector: ");
  TestCollectorVector::run();
  printf("OK\n");
  printf("Signal/CollectorUntil0: ");
  TestCollectorUntil0::run();
  printf("OK\n");
  printf("Signal/CollectorWhile0: ");
  TestCollectorWhile0::run();
  printf("OK\n");
  printf("Signal/Benchmark: Simple::Signal: ");
  bench_simple_signal();
  printf("OK\n");
  printf("Signal/Benchmark: callback loop: ");
  bench_callback_loop();
  printf("OK\n");
  return 0;
}

Assistant:

int
main (int   argc,
      char *argv[])
{
  printf ("Signal/Basic Tests: ");
  BasicSignalTests::run();
  printf ("OK\n");

  printf ("Signal/CollectorVector: ");
  TestCollectorVector::run();
  printf ("OK\n");

  printf ("Signal/CollectorUntil0: ");
  TestCollectorUntil0::run();
  printf ("OK\n");

  printf ("Signal/CollectorWhile0: ");
  TestCollectorWhile0::run();
  printf ("OK\n");

  printf ("Signal/Benchmark: Simple::Signal: ");
  bench_simple_signal();
  printf ("OK\n");

  printf ("Signal/Benchmark: callback loop: ");
  bench_callback_loop();
  printf ("OK\n");

  return 0;
}